

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_0::viewClassToName(ViewClass viewClass)

{
  char *pcStack_10;
  ViewClass viewClass_local;
  
  switch(viewClass) {
  case VIEWCLASS_128_BITS:
    pcStack_10 = "viewclass_128_bits";
    break;
  case VIEWCLASS_96_BITS:
    pcStack_10 = "viewclass_96_bits";
    break;
  case VIEWCLASS_64_BITS:
    pcStack_10 = "viewclass_64_bits";
    break;
  case VIEWCLASS_48_BITS:
    pcStack_10 = "viewclass_48_bits";
    break;
  case VIEWCLASS_32_BITS:
    pcStack_10 = "viewclass_32_bits";
    break;
  case VIEWCLASS_24_BITS:
    pcStack_10 = "viewclass_24_bits";
    break;
  case VIEWCLASS_16_BITS:
    pcStack_10 = "viewclass_16_bits";
    break;
  case VIEWCLASS_8_BITS:
    pcStack_10 = "viewclass_8_bits";
    break;
  case VIEWCLASS_EAC_R11:
    pcStack_10 = "viewclass_eac_r11";
    break;
  case VIEWCLASS_EAC_RG11:
    pcStack_10 = "viewclass_eac_rg11";
    break;
  case VIEWCLASS_ETC2_RGB:
    pcStack_10 = "viewclass_etc2_rgb";
    break;
  case VIEWCLASS_ETC2_RGBA:
    pcStack_10 = "viewclass_etc2_rgba";
    break;
  case VIEWCLASS_ETC2_EAC_RGBA:
    pcStack_10 = "viewclass_etc2_eac_rgba";
    break;
  case VIEWCLASS_ASTC_4x4_RGBA:
    pcStack_10 = "viewclass_astc_4x4_rgba";
    break;
  case VIEWCLASS_ASTC_5x4_RGBA:
    pcStack_10 = "viewclass_astc_5x4_rgba";
    break;
  case VIEWCLASS_ASTC_5x5_RGBA:
    pcStack_10 = "viewclass_astc_5x5_rgba";
    break;
  case VIEWCLASS_ASTC_6x5_RGBA:
    pcStack_10 = "viewclass_astc_6x5_rgba";
    break;
  case VIEWCLASS_ASTC_6x6_RGBA:
    pcStack_10 = "viewclass_astc_6x6_rgba";
    break;
  case VIEWCLASS_ASTC_8x5_RGBA:
    pcStack_10 = "viewclass_astc_8x5_rgba";
    break;
  case VIEWCLASS_ASTC_8x6_RGBA:
    pcStack_10 = "viewclass_astc_8x6_rgba";
    break;
  case VIEWCLASS_ASTC_8x8_RGBA:
    pcStack_10 = "viewclass_astc_8x8_rgba";
    break;
  case VIEWCLASS_ASTC_10x5_RGBA:
    pcStack_10 = "viewclass_astc_10x5_rgba";
    break;
  case VIEWCLASS_ASTC_10x6_RGBA:
    pcStack_10 = "viewclass_astc_10x6_rgba";
    break;
  case VIEWCLASS_ASTC_10x8_RGBA:
    pcStack_10 = "viewclass_astc_10x8_rgba";
    break;
  case VIEWCLASS_ASTC_10x10_RGBA:
    pcStack_10 = "viewclass_astc_10x10_rgba";
    break;
  case VIEWCLASS_ASTC_12x10_RGBA:
    pcStack_10 = "viewclass_astc_12x10_rgba";
    break;
  case VIEWCLASS_ASTC_12x12_RGBA:
    pcStack_10 = "viewclass_astc_12x12_rgba";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* viewClassToName (ViewClass viewClass)
{
	switch (viewClass)
	{
		case VIEWCLASS_128_BITS:			return "viewclass_128_bits";
		case VIEWCLASS_96_BITS:				return "viewclass_96_bits";
		case VIEWCLASS_64_BITS:				return "viewclass_64_bits";
		case VIEWCLASS_48_BITS:				return "viewclass_48_bits";
		case VIEWCLASS_32_BITS:				return "viewclass_32_bits";
		case VIEWCLASS_24_BITS:				return "viewclass_24_bits";
		case VIEWCLASS_16_BITS:				return "viewclass_16_bits";
		case VIEWCLASS_8_BITS:				return "viewclass_8_bits";
		case VIEWCLASS_EAC_R11:				return "viewclass_eac_r11";
		case VIEWCLASS_EAC_RG11:			return "viewclass_eac_rg11";
		case VIEWCLASS_ETC2_RGB:			return "viewclass_etc2_rgb";
		case VIEWCLASS_ETC2_RGBA:			return "viewclass_etc2_rgba";
		case VIEWCLASS_ETC2_EAC_RGBA:		return "viewclass_etc2_eac_rgba";
		case VIEWCLASS_ASTC_4x4_RGBA:		return "viewclass_astc_4x4_rgba";
		case VIEWCLASS_ASTC_5x4_RGBA:		return "viewclass_astc_5x4_rgba";
		case VIEWCLASS_ASTC_5x5_RGBA:		return "viewclass_astc_5x5_rgba";
		case VIEWCLASS_ASTC_6x5_RGBA:		return "viewclass_astc_6x5_rgba";
		case VIEWCLASS_ASTC_6x6_RGBA:		return "viewclass_astc_6x6_rgba";
		case VIEWCLASS_ASTC_8x5_RGBA:		return "viewclass_astc_8x5_rgba";
		case VIEWCLASS_ASTC_8x6_RGBA:		return "viewclass_astc_8x6_rgba";
		case VIEWCLASS_ASTC_8x8_RGBA:		return "viewclass_astc_8x8_rgba";
		case VIEWCLASS_ASTC_10x5_RGBA:		return "viewclass_astc_10x5_rgba";
		case VIEWCLASS_ASTC_10x6_RGBA:		return "viewclass_astc_10x6_rgba";
		case VIEWCLASS_ASTC_10x8_RGBA:		return "viewclass_astc_10x8_rgba";
		case VIEWCLASS_ASTC_10x10_RGBA:		return "viewclass_astc_10x10_rgba";
		case VIEWCLASS_ASTC_12x10_RGBA:		return "viewclass_astc_12x10_rgba";
		case VIEWCLASS_ASTC_12x12_RGBA:		return "viewclass_astc_12x12_rgba";

		default:
			DE_ASSERT(false);
			return NULL;
	}
}